

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

void __thiscall
absl::status_internal::StatusRep::SetPayload(StatusRep *this,string_view type_url,Cord *payload)

{
  Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *this_00;
  _Alloc_hider __p;
  reference pVVar1;
  Cord *pCVar2;
  Payloads *payloads;
  status_internal *this_01;
  unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
  *this_02;
  optional<unsigned_long> oVar3;
  string_view type_url_00;
  allocator<char> local_69;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  Payload local_58;
  
  type_url_00._M_len = type_url._M_str;
  payloads = (Payloads *)type_url._M_len;
  this_01 = (status_internal *)
            (this->payloads_)._M_t.
            super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
            .
            super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
            ._M_head_impl;
  this_02 = &this->payloads_;
  pCVar2 = payload;
  local_68._M_len = (size_t)payloads;
  local_68._M_str = type_url_00._M_len;
  if (this_01 == (status_internal *)0x0) {
    std::
    make_unique<absl::InlinedVector<absl::status_internal::Payload,1ul,std::allocator<absl::status_internal::Payload>>>
              ();
    __p._M_p = local_58.type_url._M_dataplus._M_p;
    local_58.type_url._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
    ::reset((__uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
             *)this_02,(pointer)__p._M_p);
    std::
    unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
    ::~unique_ptr((unique_ptr<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                   *)&local_58);
    this_01 = (status_internal *)
              (this_02->_M_t).
              super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
              .
              super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
              ._M_head_impl;
  }
  type_url_00._M_str = (char *)pCVar2;
  oVar3 = FindPayloadIndexByUrl(this_01,payloads,type_url_00);
  if (((undefined1  [16])
       oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    this_00 = &((this_02->_M_t).
                super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                .
                super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
               ._M_head_impl)->storage_;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_58,&local_68,&local_69);
    local_58.payload.contents_.data_.rep_.field_0.as_tree.cordz_info =
         (payload->contents_).data_.rep_.field_0.as_tree.cordz_info;
    local_58.payload.contents_.data_.rep_.field_0.as_tree.rep =
         (payload->contents_).data_.rep_.field_0.as_tree.rep;
    (payload->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
    (payload->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
    inlined_vector_internal::
    Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>::
    EmplaceBack<absl::status_internal::Payload>(this_00,&local_58);
    Payload::~Payload(&local_58);
  }
  else {
    pVVar1 = InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
             ::operator[]((this_02->_M_t).
                          super___uniq_ptr_impl<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_std::default_delete<absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_>_>
                          .
                          super__Head_base<0UL,_absl::InlinedVector<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>_*,_false>
                          ._M_head_impl,
                          oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_payload);
    Cord::InlineRep::operator=(&(pVVar1->payload).contents_,&payload->contents_);
  }
  return;
}

Assistant:

void StatusRep::SetPayload(absl::string_view type_url, absl::Cord payload) {
  if (payloads_ == nullptr) {
    payloads_ = absl::make_unique<status_internal::Payloads>();
  }

  absl::optional<size_t> index =
      status_internal::FindPayloadIndexByUrl(payloads_.get(), type_url);
  if (index.has_value()) {
    (*payloads_)[index.value()].payload = std::move(payload);
    return;
  }

  payloads_->push_back({std::string(type_url), std::move(payload)});
}